

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrokeTests.cpp
# Opt level: O0

void __thiscall
agge::tests::PathStrokeTests::StrokerGeneratesSinglePointSequenceForOpenSegment
          (PathStrokeTests *this)

{
  point pVar1;
  allocator local_471;
  string local_470 [32];
  LocationInfo local_450;
  undefined8 local_428;
  real_t local_420;
  undefined8 local_418;
  real_t local_410;
  undefined8 local_408;
  real_t local_400;
  undefined8 local_3f8;
  real_t local_3f0;
  undefined8 local_3e8;
  real_t local_3e0;
  point local_3d8;
  undefined1 local_3c8 [8];
  point reference2 [8];
  undefined1 local_2e8 [8];
  point points2 [8];
  string local_280 [32];
  LocationInfo local_260;
  undefined8 local_238;
  real_t local_230;
  undefined8 local_228;
  real_t local_220;
  undefined8 local_218;
  real_t local_210;
  undefined8 local_208;
  real_t local_200;
  undefined8 local_1f8;
  real_t local_1f0;
  point local_1e8;
  undefined1 local_1d8 [8];
  point reference1 [8];
  undefined1 local_f8 [8];
  point points1 [8];
  passthrough_cap local_88 [2];
  undefined1 local_68 [8];
  stroke s;
  PathStrokeTests *this_local;
  
  s._80_8_ = this;
  stroke::stroke((stroke *)local_68);
  move_to<agge::stroke>((stroke *)local_68,0.0,0.0);
  line_to<agge::stroke>((stroke *)local_68,0.0,1.0,false);
  anon_unknown_1::passthrough_cap::passthrough_cap(local_88,&this->amount_alive);
  stroke::set_cap<agge::tests::(anonymous_namespace)::passthrough_cap>((stroke *)local_68,local_88);
  anon_unknown_1::passthrough_cap::~passthrough_cap(local_88);
  anon_unknown_1::passthrough_join::passthrough_join
            ((passthrough_join *)&points1[7].y,&this->amount_alive);
  stroke::set_join<agge::tests::(anonymous_namespace)::passthrough_join>
            ((stroke *)local_68,(passthrough_join *)&points1[7].y);
  anon_unknown_1::passthrough_join::~passthrough_join((passthrough_join *)&points1[7].y);
  stroke::width((stroke *)local_68,4.0);
  pVar1 = vertex<agge::stroke>((stroke *)local_68);
  points1[0].x = (real_t)pVar1.command;
  local_f8 = pVar1._0_8_;
  pVar1 = vertex<agge::stroke>((stroke *)local_68);
  points1[1].x = (real_t)pVar1.command;
  points1[0]._4_8_ = pVar1._0_8_;
  pVar1 = vertex<agge::stroke>((stroke *)local_68);
  points1[2].x = (real_t)pVar1.command;
  points1[1]._4_8_ = pVar1._0_8_;
  pVar1 = vertex<agge::stroke>((stroke *)local_68);
  points1[3].x = (real_t)pVar1.command;
  points1[2]._4_8_ = pVar1._0_8_;
  pVar1 = vertex<agge::stroke>((stroke *)local_68);
  points1[4].x = (real_t)pVar1.command;
  points1[3]._4_8_ = pVar1._0_8_;
  pVar1 = vertex<agge::stroke>((stroke *)local_68);
  points1[5].x = (real_t)pVar1.command;
  points1[4]._4_8_ = pVar1._0_8_;
  pVar1 = vertex<agge::stroke>((stroke *)local_68);
  points1[6].x = (real_t)pVar1.command;
  points1[5]._4_8_ = pVar1._0_8_;
  pVar1 = vertex<agge::stroke>((stroke *)local_68);
  points1[7].x = (real_t)pVar1.command;
  reference1[7]._4_8_ = pVar1._0_8_;
  points1[6]._4_8_ = reference1[7]._4_8_;
  pVar1 = moveto(2.0,1.0);
  local_1e8.command = pVar1.command;
  local_1e8._0_8_ = pVar1._0_8_;
  local_1d8 = (undefined1  [8])local_1e8._0_8_;
  reference1[0].x = (real_t)local_1e8.command;
  pVar1 = lineto(0.0,0.0);
  local_1f0 = (real_t)pVar1.command;
  local_1f8 = pVar1._0_8_;
  reference1[0]._4_8_ = local_1f8;
  reference1[1].x = local_1f0;
  pVar1 = lineto(0.0,1.0);
  local_200 = (real_t)pVar1.command;
  local_208 = pVar1._0_8_;
  reference1[1]._4_8_ = local_208;
  reference1[2].x = local_200;
  pVar1 = lineto(2.0,1.0);
  local_210 = (real_t)pVar1.command;
  local_218 = pVar1._0_8_;
  reference1[2]._4_8_ = local_218;
  reference1[3].x = local_210;
  pVar1 = lineto(0.0,1.0);
  local_220 = (real_t)pVar1.command;
  local_228 = pVar1._0_8_;
  reference1[3]._4_8_ = local_228;
  reference1[4].x = local_220;
  pVar1 = lineto(0.0,0.0);
  local_230 = (real_t)pVar1.command;
  local_238 = pVar1._0_8_;
  reference1[5].y = 0.0;
  reference1[5].command = 0;
  reference1[6].x = 6.72623e-44;
  reference1[6].y = 0.0;
  reference1[6].command = 0;
  reference1[7].x = 0.0;
  reference1[4]._4_8_ = local_238;
  reference1[5].x = local_230;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_280,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/StrokeTests.cpp"
             ,(allocator *)((long)&points2[7].command + 3));
  ut::LocationInfo::LocationInfo(&local_260,(string *)local_280,0xf3);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,8ul>
            ((point (*) [8])local_1d8,(point (*) [8])local_f8,&local_260);
  ut::LocationInfo::~LocationInfo(&local_260);
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::~allocator((allocator<char> *)((long)&points2[7].command + 3));
  stroke::remove_all((stroke *)local_68);
  stroke::width((stroke *)local_68,3.0);
  move_to<agge::stroke>((stroke *)local_68,1.0,2.0);
  line_to<agge::stroke>((stroke *)local_68,4.0,6.0,false);
  pVar1 = vertex<agge::stroke>((stroke *)local_68);
  points2[0].x = (real_t)pVar1.command;
  local_2e8 = pVar1._0_8_;
  pVar1 = vertex<agge::stroke>((stroke *)local_68);
  points2[1].x = (real_t)pVar1.command;
  points2[0]._4_8_ = pVar1._0_8_;
  pVar1 = vertex<agge::stroke>((stroke *)local_68);
  points2[2].x = (real_t)pVar1.command;
  points2[1]._4_8_ = pVar1._0_8_;
  pVar1 = vertex<agge::stroke>((stroke *)local_68);
  points2[3].x = (real_t)pVar1.command;
  points2[2]._4_8_ = pVar1._0_8_;
  pVar1 = vertex<agge::stroke>((stroke *)local_68);
  points2[4].x = (real_t)pVar1.command;
  points2[3]._4_8_ = pVar1._0_8_;
  pVar1 = vertex<agge::stroke>((stroke *)local_68);
  points2[5].x = (real_t)pVar1.command;
  points2[4]._4_8_ = pVar1._0_8_;
  pVar1 = vertex<agge::stroke>((stroke *)local_68);
  points2[6].x = (real_t)pVar1.command;
  points2[5]._4_8_ = pVar1._0_8_;
  pVar1 = vertex<agge::stroke>((stroke *)local_68);
  points2[7].x = (real_t)pVar1.command;
  reference2[7]._4_8_ = pVar1._0_8_;
  points2[6]._4_8_ = reference2[7]._4_8_;
  pVar1 = moveto(1.5,5.0);
  local_3d8.command = pVar1.command;
  local_3d8._0_8_ = pVar1._0_8_;
  local_3c8 = (undefined1  [8])local_3d8._0_8_;
  reference2[0].x = (real_t)local_3d8.command;
  pVar1 = lineto(1.0,2.0);
  local_3e0 = (real_t)pVar1.command;
  local_3e8 = pVar1._0_8_;
  reference2[0]._4_8_ = local_3e8;
  reference2[1].x = local_3e0;
  pVar1 = lineto(4.0,6.0);
  local_3f0 = (real_t)pVar1.command;
  local_3f8 = pVar1._0_8_;
  reference2[1]._4_8_ = local_3f8;
  reference2[2].x = local_3f0;
  pVar1 = lineto(1.5,5.0);
  local_400 = (real_t)pVar1.command;
  local_408 = pVar1._0_8_;
  reference2[2]._4_8_ = local_408;
  reference2[3].x = local_400;
  pVar1 = lineto(4.0,6.0);
  local_410 = (real_t)pVar1.command;
  local_418 = pVar1._0_8_;
  reference2[3]._4_8_ = local_418;
  reference2[4].x = local_410;
  pVar1 = lineto(1.0,2.0);
  local_420 = (real_t)pVar1.command;
  local_428 = pVar1._0_8_;
  reference2[5].y = 0.0;
  reference2[5].command = 0;
  reference2[6].x = 6.72623e-44;
  reference2[6].y = 0.0;
  reference2[6].command = 0;
  reference2[7].x = 0.0;
  reference2[4]._4_8_ = local_428;
  reference2[5].x = local_420;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_470,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/StrokeTests.cpp"
             ,&local_471);
  ut::LocationInfo::LocationInfo(&local_450,(string *)local_470,0x106);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,8ul>
            ((point (*) [8])local_3c8,(point (*) [8])local_2e8,&local_450);
  ut::LocationInfo::~LocationInfo(&local_450);
  std::__cxx11::string::~string(local_470);
  std::allocator<char>::~allocator((allocator<char> *)&local_471);
  stroke::~stroke((stroke *)local_68);
  return;
}

Assistant:

test( StrokerGeneratesSinglePointSequenceForOpenSegment )
			{
				// INIT
				stroke s;

				move_to(s, 0.0f, 0.0f);
				line_to(s, 0.0f, 1.0f);

				s.set_cap(passthrough_cap(amount_alive));
				s.set_join(passthrough_join(amount_alive));
				s.width(4.0f);

				// ACT
				mocks::path::point points1[] = { vertex(s), vertex(s), vertex(s), vertex(s), vertex(s), vertex(s), vertex(s), vertex(s), };

				// ASSERT
				mocks::path::point reference1[] = {
					moveto(2.0f, 1.0f), lineto(0.0f, 0.0f), lineto(0.0f, 1.0f),
					lineto(2.0f, 1.0f), lineto(0.0f, 1.0f), lineto(0.0f, 0.0f),
					{ 0.0f, 0.0f, path_command_end_poly | path_flag_close },
					{ 0.0f, 0.0f, path_command_stop },
				};

				assert_equal(reference1, points1);

				// INIT
				s.remove_all();
				s.width(3.0f);
				move_to(s, 1.0f, 2.0f);
				line_to(s, 4.0f, 6.0f);

				// ACT
				mocks::path::point points2[] = { vertex(s), vertex(s), vertex(s), vertex(s), vertex(s), vertex(s), vertex(s), vertex(s), };

				// ASSERT
				mocks::path::point reference2[] = {
					moveto(1.5f, 5.0f), lineto(1.0f, 2.0f), lineto(4.0f, 6.0f),
					lineto(1.5f, 5.0f), lineto(4.0f, 6.0f), lineto(1.0f, 2.0f),
					{ 0.0f, 0.0f, path_command_end_poly | path_flag_close },
					{ 0.0f, 0.0f, path_command_stop },
				};

				assert_equal(reference2, points2);
			}